

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_RecordImplicitCall(InterpreterStackFrame *this,uint loopNumber)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags flags;
  uint uVar3;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  DynamicProfileInfo *this_00;
  ThreadContext *this_01;
  ThreadContext *threadContext;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *functionBody;
  uint loopNumber_local;
  InterpreterStackFrame *this_local;
  
  pFVar4 = GetFunctionBody(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(pFVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x169d,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = FunctionBody::GetLoopCount(*(FunctionBody **)(this + 0x88));
  if (uVar3 <= loopNumber) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x169e,"(loopNumber < this->m_functionBody->GetLoopCount())",
                                "loopNumber < this->m_functionBody->GetLoopCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pFVar4 = *(FunctionBody **)(this + 0x88);
  this_00 = FunctionBody::GetDynamicProfileInfo(pFVar4);
  this_01 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
  flags = ThreadContext::GetImplicitCallFlags(this_01);
  DynamicProfileInfo::RecordLoopImplicitCallFlags(this_00,pFVar4,loopNumber,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_RecordImplicitCall(uint loopNumber)
    {
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        Assert(loopNumber < this->m_functionBody->GetLoopCount());

        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        dynamicProfileInfo->RecordLoopImplicitCallFlags(functionBody, loopNumber, threadContext->GetImplicitCallFlags());
    }